

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_C_Test::~PhPacker_Arg_C_Test(PhPacker_Arg_C_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_C)
{
   std::string str = PhPacker::pack<unsigned char>('C', 123);
   unsigned char result = std::any_cast<unsigned char>(PhPacker::unpack('C', str));
   unsigned char expected = 123;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<unsigned char>('C', 200);
   result = std::any_cast<unsigned char>(PhPacker::unpack('C', str));
   expected = 200;
   GTEST_ASSERT_EQ(result, expected);
}